

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

void __thiscall internalJSONNode::Set(internalJSONNode *this,double val)

{
  NumberToString *in_RSI;
  json_string local_30;
  
  this->_type = '\x02';
  (this->_value)._number = val;
  NumberToString::_ftoa_abi_cxx11_(&local_30,in_RSI,val);
  std::__cxx11::string::operator=((string *)&this->_string,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  this->fetched = true;
  return;
}

Assistant:

void internalJSONNode::Set(bool val) json_nothrow {
    makeNotContainer();
    _type = JSON_BOOL;
    _value._bool = val;
    #if(defined(JSON_CASTABLE) || !defined(JSON_LESS_MEMORY) || defined(JSON_WRITE_PRIORITY))
	   _string = val ? json_global(CONST_TRUE) : json_global(CONST_FALSE);
    #endif
    SetFetched(true);
}